

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_put(bsc_step_t depends,bsc_pid_t dst_pid,void *src,void *dst,bsc_size_t offset,bsc_size_t size)

{
  bsp_pid_t bVar1;
  request_t *prVar2;
  comm_request_t r;
  request_t *req;
  bsc_size_t size_local;
  bsc_size_t offset_local;
  void *dst_local;
  void *src_local;
  bsc_pid_t dst_pid_local;
  bsc_step_t depends_local;
  
  bVar1 = bsp_pid();
  prVar2 = new_request(depends);
  prVar2->kind = PUT;
  (prVar2->payload).put.src_addr = src;
  (prVar2->payload).put.dst_addr = dst;
  (prVar2->payload).exec.a0 = (void *)CONCAT44(dst_pid,bVar1);
  (prVar2->payload).exec.xs = (void *)CONCAT44(offset,size);
  return depends + 1;
}

Assistant:

bsc_step_t bsc_put( bsc_step_t depends, bsc_pid_t dst_pid, 
        const void * src, void * dst, bsc_size_t offset, bsc_size_t size)
{
    request_t * req;
    comm_request_t r;
    r.src_addr = src;
    r.dst_addr = dst;
    r.src_pid = bsp_pid();
    r.dst_pid = dst_pid;
    r.size = size;
    r.offset = offset;
        
    req = new_request( depends );
    req->kind = PUT;
    req->payload.put = r;
    return depends + 1;
}